

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

Orphan<capnp::DynamicValue> * __thiscall
capnp::compiler::ValueTranslator::compileValueInner
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,ValueTranslator *this,Reader src,
          Type type)

{
  ushort uVar1;
  Resolver *pRVar2;
  ErrorReporter *pEVar3;
  ushort *puVar4;
  Builder builder;
  Reader src_00;
  Reader copyFrom;
  Reader assignments;
  bool bVar5;
  int64_t iVar6;
  StructSchema SVar7;
  Which WVar8;
  uint index;
  undefined8 uVar9;
  uint8_t uVar10;
  NullableValue<capnp::DynamicValue::Reader> *this_00;
  char (*params_2) [2];
  ulong uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ArrayPtr<const_capnp::word> array;
  Reader RVar14;
  StringPtr SVar15;
  Type type_00;
  Reader RVar16;
  Reader copyFrom_00;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  StringPtr message_03;
  ReaderOptions options;
  Type type_local;
  Array<capnp::word> copy;
  uint local_390;
  NullableValue<kj::Array<const_unsigned_char>_> data;
  undefined1 local_340 [8];
  anon_union_72_1_a8c68091_for_NullableValue<capnp::DynamicValue::Reader>_2 local_338;
  NullableValue<capnp::DynamicValue::Reader> constValue;
  Reader local_1e8;
  Reader local_1b0;
  Builder local_180;
  StructReader local_150;
  Orphan<capnp::DynamicList> result_1;
  Reader local_f0;
  Reader local_a8;
  Reader local_60;
  
  type_local.field_4 = type.field_4;
  type_local._0_8_ = type._0_8_;
  if (src._reader.dataSize < 0x10) {
switchD_00183e0e_caseD_0:
    __return_storage_ptr__->type = UNKNOWN;
    goto LAB_00183dd1;
  }
  puVar4 = (ushort *)src._reader.data;
  uVar1 = *puVar4;
  if (0xd < (ulong)uVar1) {
    kj::_::unreachable();
  }
  params_2 = (char (*) [2])
             ((long)&switchD_00183e0e::switchdataD_001da23c +
             (long)(int)(&switchD_00183e0e::switchdataD_001da23c)[uVar1]);
  WVar8 = type.baseType;
  uVar10 = type.listDepth;
  switch(uVar1) {
  case 0:
    goto switchD_00183e0e_caseD_0;
  case 1:
    if (src._reader.dataSize < 0x80) {
      iVar6 = 0;
    }
    else {
      iVar6 = *(int64_t *)(puVar4 + 4);
    }
    __return_storage_ptr__->type = UINT;
    (__return_storage_ptr__->field_1).intValue = iVar6;
    goto LAB_00183dd1;
  case 2:
    if (src._reader.dataSize < 0x80) {
      uVar11 = 0;
LAB_001843a5:
      __return_storage_ptr__->type = INT;
      (__return_storage_ptr__->field_1).intValue = -uVar11;
      goto LAB_00183dd1;
    }
    uVar11 = *(ulong *)(puVar4 + 4);
    if (uVar11 < 0x8000000000000001) goto LAB_001843a5;
    message_00.content.size_ = 0x23;
    message_00.content.ptr = "Integer is too big to be negative.";
    ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
              (this->errorReporter,&src,message_00);
    goto LAB_001845b5;
  case 3:
    uVar12 = 0;
    uVar13 = 0;
    if (0x7f < src._reader.dataSize) {
      uVar12 = (undefined4)*(undefined8 *)(puVar4 + 4);
      uVar13 = (undefined4)((ulong)*(undefined8 *)(puVar4 + 4) >> 0x20);
    }
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = CONCAT44(uVar13,uVar12);
LAB_00183dd1:
    (__return_storage_ptr__->builder).tag.content = 0;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
    (__return_storage_ptr__->builder).location = (word *)0x0;
    return __return_storage_ptr__;
  case 4:
    if (uVar10 == '\0' && WVar8 == DATA) {
      RVar14 = Expression::Reader::getString(&src);
      copyFrom_00.super_ArrayPtr<const_unsigned_char>.size_ =
           RVar14.super_StringPtr.content.size_ - 1;
      copyFrom_00.super_ArrayPtr<const_unsigned_char>.ptr = RVar14.super_StringPtr.content.ptr;
      Orphanage::newOrphanCopy<capnp::Data::Reader>
                ((Orphan<capnp::Data> *)&constValue,&this->orphanage,copyFrom_00);
      Orphan<capnp::DynamicValue>::Orphan<capnp::Data>
                (__return_storage_ptr__,(Orphan<capnp::Data> *)&constValue);
    }
    else {
      RVar14 = Expression::Reader::getString(&src);
      Orphanage::newOrphanCopy<capnp::Text::Reader>
                ((Orphan<capnp::Text> *)&constValue,&this->orphanage,RVar14);
      Orphan<capnp::DynamicValue>::Orphan<capnp::Text>
                (__return_storage_ptr__,(Orphan<capnp::Text> *)&constValue);
    }
    break;
  case 5:
    Expression::Reader::getRelativeName((Reader *)&data,&src);
    SVar15.content = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)&data);
    copy._0_16_ = SVar15.content;
    if ((type_local.baseType == ENUM) && (type_local.listDepth == '\0')) {
      local_340 = (undefined1  [8])Type::asEnum(&type_local);
      EnumSchema::findEnumerantByName
                ((Maybe<capnp::EnumSchema::Enumerant> *)&constValue,(EnumSchema *)local_340,SVar15);
      if (constValue.isSet == true) {
        __return_storage_ptr__->type = ENUM;
        (__return_storage_ptr__->field_1).intValue = constValue.field_1._0_8_;
        (__return_storage_ptr__->field_1).enumValue.value = constValue.field_1._8_2_;
        (__return_storage_ptr__->builder).tag.content = 0;
        (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
        (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
        (__return_storage_ptr__->builder).location = (word *)0x0;
        return __return_storage_ptr__;
      }
    }
    else {
      constValue._0_8_ = anon_var_dwarf_6a414;
      constValue.field_1._0_8_ = 5;
      bVar5 = kj::StringPtr::operator==((StringPtr *)&copy,(StringPtr *)&constValue);
      if (bVar5) {
        __return_storage_ptr__->type = VOID;
        goto LAB_001845bd;
      }
      constValue._0_8_ = (long)"if parameter list is non-empty, isGeneric must be true" + 0x32;
      constValue.field_1._0_8_ = 5;
      bVar5 = kj::StringPtr::operator==((StringPtr *)&copy,(StringPtr *)&constValue);
      if (bVar5) {
        __return_storage_ptr__->type = BOOL;
        (__return_storage_ptr__->field_1).boolValue = true;
        goto LAB_001845bd;
      }
      constValue._0_8_ = anon_var_dwarf_18910;
      constValue.field_1._0_8_ = 6;
      bVar5 = kj::StringPtr::operator==((StringPtr *)&copy,(StringPtr *)&constValue);
      if (bVar5) {
        __return_storage_ptr__->type = BOOL;
        (__return_storage_ptr__->field_1).boolValue = false;
        goto LAB_001845bd;
      }
      constValue._0_8_ = anon_var_dwarf_6a441;
      constValue.field_1._0_8_ = 4;
      bVar5 = kj::StringPtr::operator==((StringPtr *)&copy,(StringPtr *)&constValue);
      if (bVar5) {
        __return_storage_ptr__->type = FLOAT;
        iVar6 = 0x7ff8000000000000;
LAB_001848d9:
        (__return_storage_ptr__->field_1).intValue = iVar6;
        (__return_storage_ptr__->builder).tag.content = 0;
        (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
        (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
        (__return_storage_ptr__->builder).location = (word *)0x0;
        return __return_storage_ptr__;
      }
      constValue._0_8_ = (long)"-inf" + 1;
      constValue.field_1._0_8_ = 4;
      bVar5 = kj::StringPtr::operator==((StringPtr *)&copy,(StringPtr *)&constValue);
      if (bVar5) {
        __return_storage_ptr__->type = FLOAT;
        iVar6 = 0x7ff0000000000000;
        goto LAB_001848d9;
      }
    }
    (**this->resolver->_vptr_Resolver)((NullableValue<capnp::DynamicValue::Reader> *)local_340);
    kj::_::NullableValue<capnp::DynamicValue::Reader>::NullableValue
              (&constValue,(NullableValue<capnp::DynamicValue::Reader> *)local_340);
    kj::_::NullableValue<capnp::DynamicValue::Reader>::~NullableValue
              ((NullableValue<capnp::DynamicValue::Reader> *)local_340);
    if (constValue.isSet == true) {
      DynamicValue::Reader::Reader(&local_a8,&constValue.field_1.value);
      Orphanage::newOrphanCopy<capnp::DynamicValue::Reader>
                (__return_storage_ptr__,&this->orphanage,&local_a8);
      DynamicValue::Reader::~Reader(&local_a8);
      goto LAB_00184994;
    }
    goto LAB_00184981;
  case 6:
    if (uVar10 != '\0') {
      type_00 = (Type)Type::asList(&type_local);
      Expression::Reader::getList((Reader *)&copy,&src);
      Orphanage::newOrphan(&result_1,&this->orphanage,(ListSchema)type_00,local_390);
      Orphan<capnp::DynamicList>::get((Builder *)&data,&result_1);
      for (index = 0; index < local_390; index = index + 1) {
        _::ListReader::getStructElement(&local_150,(ListReader *)&copy,index);
        src_00._reader.capTable._0_4_ = (int)local_150.capTable;
        src_00._reader.segment = local_150.segment;
        src_00._reader.capTable._4_4_ = (int)((ulong)local_150.capTable >> 0x20);
        src_00._reader.data._0_4_ = (int)local_150.data;
        src_00._reader.data._4_4_ = (int)((ulong)local_150.data >> 0x20);
        src_00._reader.pointers._0_4_ = (int)local_150.pointers;
        src_00._reader.pointers._4_4_ = (int)((ulong)local_150.pointers >> 0x20);
        src_00._reader.dataSize = local_150.dataSize;
        src_00._reader._36_4_ = local_150._36_4_;
        src_00._reader.nestingLimit = local_150.nestingLimit;
        src_00._reader._44_4_ = local_150._44_4_;
        compileValue((Maybe<capnp::Orphan<capnp::DynamicValue>_> *)local_340,this,src_00,type_00);
        kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::NullableValue
                  ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)&constValue,
                   (NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_340);
        kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue
                  ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_340);
        if (constValue.isSet == true) {
          DynamicList::Builder::adopt
                    ((Builder *)&data,index,(Orphan<capnp::DynamicValue> *)&constValue.field_1.value
                    );
        }
        kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue
                  ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)&constValue);
      }
      Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicList>(__return_storage_ptr__,&result_1);
      this_00 = (NullableValue<capnp::DynamicValue::Reader> *)&result_1.builder;
      goto LAB_0018436d;
    }
    pEVar3 = this->errorReporter;
    makeTypeName((String *)local_340,this,type);
    kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
              ((String *)&constValue,(kj *)"Type mismatch; expected ",(char (*) [25])local_340,
               (String *)0x1db34d,params_2);
    if (constValue.field_1._0_8_ == 0) {
      constValue._0_8_ = "";
    }
    message_03.content.size_ = constValue.field_1._0_8_ + (ulong)(constValue.field_1._0_8_ == 0);
    message_03.content.ptr = (char *)constValue._0_8_;
    ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>(pEVar3,&src,message_03);
    goto LAB_0018459b;
  case 7:
    if (WVar8 == STRUCT && uVar10 == '\0') {
      SVar7 = Type::asStruct(&type_local);
      Orphanage::newOrphan((Orphan<capnp::DynamicStruct> *)&constValue,&this->orphanage,SVar7);
      Orphan<capnp::DynamicStruct>::get(&local_180,(Orphan<capnp::DynamicStruct> *)&constValue);
      Expression::Reader::getTuple(&local_1b0,&src);
      builder.builder.segment._0_4_ = (int)local_180.builder.segment;
      builder.schema.super_Schema.raw = local_180.schema.super_Schema.raw;
      builder.builder.segment._4_4_ = (int)((ulong)local_180.builder.segment >> 0x20);
      builder.builder.capTable._0_4_ = (int)local_180.builder.capTable;
      builder.builder.capTable._4_4_ = (int)((ulong)local_180.builder.capTable >> 0x20);
      builder.builder.data._0_4_ = (int)local_180.builder.data;
      builder.builder.data._4_4_ = (int)((ulong)local_180.builder.data >> 0x20);
      builder.builder.pointers._0_4_ = (int)local_180.builder.pointers;
      builder.builder.pointers._4_4_ = (int)((ulong)local_180.builder.pointers >> 0x20);
      builder.builder.dataSize = local_180.builder.dataSize;
      builder.builder._36_4_ = local_180.builder._36_4_;
      assignments.reader.capTable = local_1b0.reader.capTable;
      assignments.reader.segment = local_1b0.reader.segment;
      assignments.reader.ptr = local_1b0.reader.ptr;
      assignments.reader.elementCount = local_1b0.reader.elementCount;
      assignments.reader.step = local_1b0.reader.step;
      assignments.reader.structDataSize = local_1b0.reader.structDataSize;
      assignments.reader.structPointerCount = local_1b0.reader.structPointerCount;
      assignments.reader.elementSize = local_1b0.reader.elementSize;
      assignments.reader._39_1_ = local_1b0.reader._39_1_;
      assignments.reader.nestingLimit = local_1b0.reader.nestingLimit;
      assignments.reader._44_4_ = local_1b0.reader._44_4_;
      fillStructValue(this,builder,assignments);
      Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>
                (__return_storage_ptr__,(Orphan<capnp::DynamicStruct> *)&constValue);
      this_00 = (NullableValue<capnp::DynamicValue::Reader> *)&constValue.field_1;
      goto LAB_0018436d;
    }
    pEVar3 = this->errorReporter;
    makeTypeName((String *)local_340,this,type);
    kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
              ((String *)&constValue,(kj *)"Type mismatch; expected ",(char (*) [25])local_340,
               (String *)0x1db34d,params_2);
    if (constValue.field_1._0_8_ == 0) {
      constValue._0_8_ = "";
    }
    message_01.content.size_ = constValue.field_1._0_8_ + (ulong)(constValue.field_1._0_8_ == 0);
    message_01.content.ptr = (char *)constValue._0_8_;
    ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>(pEVar3,&src,message_01);
LAB_0018459b:
    kj::Array<char>::~Array((Array<char> *)&constValue);
    kj::Array<char>::~Array((Array<char> *)local_340);
LAB_001845b5:
    __return_storage_ptr__->type = UNKNOWN;
LAB_001845bd:
    (__return_storage_ptr__->builder).tag.content = 0;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
    (__return_storage_ptr__->builder).location = (word *)0x0;
    return __return_storage_ptr__;
  case 8:
    if (WVar8 != DATA || uVar10 != '\0') {
      pEVar3 = this->errorReporter;
      makeTypeName((String *)local_340,this,type);
      kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
                ((String *)&constValue,(kj *)"Type mismatch; expected ",(char (*) [25])local_340,
                 (String *)0x1db34d,params_2);
      if (constValue.field_1._0_8_ == 0) {
        constValue._0_8_ = "";
      }
      message_02.content.size_ = constValue.field_1._0_8_ + (ulong)(constValue.field_1._0_8_ == 0);
      message_02.content.ptr = (char *)constValue._0_8_;
      ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>(pEVar3,&src,message_02);
      goto LAB_0018459b;
    }
    RVar16 = Expression::Reader::getBinary(&src);
    Orphanage::newOrphanCopy<capnp::Data::Reader>
              ((Orphan<capnp::Data> *)&constValue,&this->orphanage,RVar16);
    Orphan<capnp::DynamicValue>::Orphan<capnp::Data>
              (__return_storage_ptr__,(Orphan<capnp::Data> *)&constValue);
    break;
  default:
    (**this->resolver->_vptr_Resolver)((NullableValue<capnp::DynamicValue::Reader> *)local_340);
    kj::_::NullableValue<capnp::DynamicValue::Reader>::NullableValue
              (&constValue,(NullableValue<capnp::DynamicValue::Reader> *)local_340);
    kj::_::NullableValue<capnp::DynamicValue::Reader>::~NullableValue
              ((NullableValue<capnp::DynamicValue::Reader> *)local_340);
    if (constValue.isSet == true) {
      DynamicValue::Reader::Reader(&local_f0,&constValue.field_1.value);
      Orphanage::newOrphanCopy<capnp::DynamicValue::Reader>
                (__return_storage_ptr__,&this->orphanage,&local_f0);
      DynamicValue::Reader::~Reader(&local_f0);
      goto LAB_00184994;
    }
LAB_00184981:
    __return_storage_ptr__->type = UNKNOWN;
    (__return_storage_ptr__->builder).tag.content = 0;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
    (__return_storage_ptr__->builder).location = (word *)0x0;
LAB_00184994:
    kj::_::NullableValue<capnp::DynamicValue::Reader>::~NullableValue(&constValue);
    return __return_storage_ptr__;
  case 0xd:
    pRVar2 = this->resolver;
    Expression::Reader::getEmbed(&local_60,&src);
    (*pRVar2->_vptr_Resolver[1])(&constValue,pRVar2);
    data.isSet = constValue.isSet;
    if (constValue.isSet == true) {
      data.field_1.value.ptr = (uchar *)constValue.field_1._0_8_;
      data.field_1.value.size_._0_4_ = (undefined4)constValue.field_1._8_8_;
      data.field_1.value.size_._4_4_ = (undefined4)((ulong)constValue.field_1._8_8_ >> 0x20);
      data.field_1.value.disposer = (ArrayDisposer *)constValue.field_1._16_8_;
      constValue.field_1._0_8_ = 0;
      constValue.field_1._8_8_ = 0;
    }
    kj::_::NullableValue<kj::Array<const_unsigned_char>_>::~NullableValue
              ((NullableValue<kj::Array<const_unsigned_char>_> *)&constValue);
    if (data.isSet == true) {
      WVar8 = LIST;
      if (type_local.listDepth == '\0') {
        WVar8 = type_local.baseType;
      }
      if (WVar8 == TEXT) {
        Orphanage::newOrphan<capnp::Text>
                  ((Orphan<capnp::Text> *)&constValue,&this->orphanage,
                   data.field_1.value.size_._0_4_);
        _::OrphanBuilder::asText((Builder *)local_340,(OrphanBuilder *)&constValue);
        memcpy((void *)local_338._0_8_,data.field_1.value.ptr,
               CONCAT44(data.field_1.value.size_._4_4_,data.field_1.value.size_._0_4_));
        Orphan<capnp::DynamicValue>::Orphan<capnp::Text>
                  (__return_storage_ptr__,(Orphan<capnp::Text> *)&constValue);
        _::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&constValue);
        goto LAB_001846ef;
      }
      if (WVar8 == DATA) {
        RVar16.super_ArrayPtr<const_unsigned_char>.size_._0_4_ = data.field_1.value.size_._0_4_;
        RVar16.super_ArrayPtr<const_unsigned_char>.ptr = data.field_1.value.ptr;
        RVar16.super_ArrayPtr<const_unsigned_char>.size_._4_4_ = data.field_1.value.size_._4_4_;
        Orphanage::newOrphanCopy<capnp::Data::Reader>
                  ((Orphan<capnp::Data> *)&constValue,&this->orphanage,RVar16);
        Orphan<capnp::DynamicValue>::Orphan<capnp::Data>
                  (__return_storage_ptr__,(Orphan<capnp::Data> *)&constValue);
        _::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&constValue);
        goto LAB_001846ef;
      }
      if (WVar8 == STRUCT) {
        if ((data.field_1.value.size_._0_4_ & 7) == 0) {
          copy.disposer = (ArrayDisposer *)0x0;
          copy._0_16_ = ZEXT816(0);
          uVar11 = CONCAT44(data.field_1.value.size_._4_4_,data.field_1.value.size_._0_4_) >> 3;
          uVar9 = data.field_1.value.ptr;
          if (((ulong)data.field_1.value.ptr & 7) != 0) {
            constValue._0_8_ = kj::_::HeapArrayDisposer::allocate<capnp::word>(uVar11);
            constValue.field_1._8_8_ = &kj::_::HeapArrayDisposer::instance;
            constValue.field_1._0_8_ = uVar11;
            kj::Array<capnp::word>::operator=(&copy,(Array<capnp::word> *)&constValue);
            kj::Array<capnp::word>::~Array((Array<capnp::word> *)&constValue);
            memcpy(copy.ptr,data.field_1.value.ptr,
                   CONCAT44(data.field_1.value.size_._4_4_,data.field_1.value.size_._0_4_));
            uVar9 = copy.ptr;
            uVar11 = copy.size_;
          }
          array.size_ = uVar11;
          array.ptr = (word *)uVar9;
          options._8_8_ = 0x7fffffff;
          options.traversalLimitInWords = 0xffffffffffffffff;
          FlatArrayMessageReader::FlatArrayMessageReader
                    ((FlatArrayMessageReader *)&constValue,array,options);
          SVar7 = Type::asStruct(&type_local);
          MessageReader::getRoot<capnp::DynamicStruct,capnp::StructSchema>
                    (&local_1e8,(MessageReader *)&constValue,SVar7);
          copyFrom.reader.segment._0_4_ = (int)local_1e8.reader.segment;
          copyFrom.schema.super_Schema.raw = local_1e8.schema.super_Schema.raw;
          copyFrom.reader.segment._4_4_ = (int)((ulong)local_1e8.reader.segment >> 0x20);
          copyFrom.reader.capTable._0_4_ = (int)local_1e8.reader.capTable;
          copyFrom.reader.capTable._4_4_ = (int)((ulong)local_1e8.reader.capTable >> 0x20);
          copyFrom.reader.data._0_4_ = (int)local_1e8.reader.data;
          copyFrom.reader.data._4_4_ = (int)((ulong)local_1e8.reader.data >> 0x20);
          copyFrom.reader.pointers._0_4_ = (int)local_1e8.reader.pointers;
          copyFrom.reader.pointers._4_4_ = (int)((ulong)local_1e8.reader.pointers >> 0x20);
          copyFrom.reader.dataSize = local_1e8.reader.dataSize;
          copyFrom.reader._36_4_ = local_1e8.reader._36_4_;
          copyFrom.reader.nestingLimit = local_1e8.reader.nestingLimit;
          copyFrom.reader._44_4_ = local_1e8.reader._44_4_;
          Orphanage::newOrphanCopy<capnp::DynamicStruct::Reader>
                    ((Orphan<capnp::DynamicStruct> *)local_340,&this->orphanage,copyFrom);
          Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>
                    (__return_storage_ptr__,(Orphan<capnp::DynamicStruct> *)local_340);
          _::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&local_338);
          UnalignedFlatArrayMessageReader::~UnalignedFlatArrayMessageReader
                    ((UnalignedFlatArrayMessageReader *)&constValue);
          kj::Array<capnp::word>::~Array(&copy);
          goto LAB_001846ef;
        }
        message.content.size_ = 0x32;
        message.content.ptr = "Embedded file is not a valid Cap\'n Proto message.";
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  (this->errorReporter,&src,message);
      }
      else {
        SVar15.content.size_ = 0x42;
        SVar15.content.ptr = "Embeds can only be used when Text, Data, or a struct is expected.";
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  (this->errorReporter,&src,SVar15);
      }
    }
    __return_storage_ptr__->type = UNKNOWN;
    (__return_storage_ptr__->builder).tag.content = 0;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
    (__return_storage_ptr__->builder).location = (word *)0x0;
LAB_001846ef:
    kj::_::NullableValue<kj::Array<const_unsigned_char>_>::~NullableValue(&data);
    return __return_storage_ptr__;
  }
  this_00 = &constValue;
LAB_0018436d:
  _::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> ValueTranslator::compileValueInner(Expression::Reader src, Type type) {
  switch (src.which()) {
    case Expression::RELATIVE_NAME: {
      auto name = src.getRelativeName();

      // The name is just a bare identifier.  It may be a literal value or an enumerant.
      kj::StringPtr id = name.getValue();

      if (type.isEnum()) {
        KJ_IF_MAYBE(enumerant, type.asEnum().findEnumerantByName(id)) {
          return DynamicEnum(*enumerant);
        }
      } else {
        // Interpret known constant values.
        if (id == "void") {
          return VOID;
        } else if (id == "true") {
          return true;
        } else if (id == "false") {
          return false;
        } else if (id == "nan") {
          return kj::nan();
        } else if (id == "inf") {
          return kj::inf();
        }
      }

      // Apparently not a literal. Try resolving it.
      KJ_IF_MAYBE(constValue, resolver.resolveConstant(src)) {
        return orphanage.newOrphanCopy(*constValue);
      } else {
        return nullptr;
      }
    }

    case Expression::ABSOLUTE_NAME:
    case Expression::IMPORT:
    case Expression::APPLICATION:
    case Expression::MEMBER:
      KJ_IF_MAYBE(constValue, resolver.resolveConstant(src)) {
        return orphanage.newOrphanCopy(*constValue);
      } else {
        return nullptr;
      }

    case Expression::EMBED:
      KJ_IF_MAYBE(data, resolver.readEmbed(src.getEmbed())) {
        switch (type.which()) {
          case schema::Type::TEXT: {
            // Sadly, we need to make a copy to add the NUL terminator.
            auto text = orphanage.newOrphan<Text>(data->size());
            memcpy(text.get().begin(), data->begin(), data->size());
            return kj::mv(text);
          }
          case schema::Type::DATA:
            // TODO(perf): It would arguably be neat to use orphanage.referenceExternalData(),
            //   since typically the data is mmap()ed and this would avoid forcing a large file
            //   to become memory-resident. However, we'd have to figure out who should own the
            //   Array<byte>. Also, we'd have to deal with the possibility of misaligned data --
            //   though arguably in that case we know it's not mmap()ed so whatever. One more
            //   thing: it would be neat to be able to reference text blobs this way too, if only
            //   we could rely on the assumption that as long as the data doesn't end on a page
            //   boundary, it will be zero-padded, thus giving us our NUL terminator (4095/4096 of
            //   the time), but this seems to require documenting constraints on the underlying
            //   file-reading interfaces. Hm.
            return orphanage.newOrphanCopy(Data::Reader(*data));
          case schema::Type::STRUCT: {
            // We will almost certainly
            if (data->size() % sizeof(word) != 0) {
              errorReporter.addErrorOn(src,
                  "Embedded file is not a valid Cap'n Proto message.");
              return nullptr;
            }
            kj::Array<word> copy;
            kj::ArrayPtr<const word> words;
            if (reinterpret_cast<uintptr_t>(data->begin()) % sizeof(void*) == 0) {
              // Hooray, data is aligned.
              words = kj::ArrayPtr<const word>(
                  reinterpret_cast<const word*>(data->begin()),
                  data->size() / sizeof(word));
            } else {
              // Ugh, data not aligned. Make a copy.
              copy = kj::heapArray<word>(data->size() / sizeof(word));
              memcpy(copy.begin(), data->begin(), data->size());
              words = copy;
            }
            ReaderOptions options;
            options.traversalLimitInWords = kj::maxValue;
            options.nestingLimit = kj::maxValue;
            FlatArrayMessageReader reader(words, options);
            return orphanage.newOrphanCopy(reader.getRoot<DynamicStruct>(type.asStruct()));
          }
          default:
            errorReporter.addErrorOn(src,
                "Embeds can only be used when Text, Data, or a struct is expected.");
            return nullptr;
        }
      } else {
        return nullptr;
      }

    case Expression::POSITIVE_INT:
      return src.getPositiveInt();

    case Expression::NEGATIVE_INT: {
      uint64_t nValue = src.getNegativeInt();
      if (nValue > ((uint64_t)kj::maxValue >> 1) + 1) {
        errorReporter.addErrorOn(src, "Integer is too big to be negative.");
        return nullptr;
      } else {
        return kj::implicitCast<int64_t>(-nValue);
      }
    }

    case Expression::FLOAT:
      return src.getFloat();
      break;

    case Expression::STRING:
      if (type.isData()) {
        Text::Reader text = src.getString();
        return orphanage.newOrphanCopy(Data::Reader(text.asBytes()));
      } else {
        return orphanage.newOrphanCopy(src.getString());
      }
      break;

    case Expression::BINARY:
      if (!type.isData()) {
        errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
        return nullptr;
      }
      return orphanage.newOrphanCopy(src.getBinary());

    case Expression::LIST: {
      if (!type.isList()) {
        errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
        return nullptr;
      }
      auto listSchema = type.asList();
      Type elementType = listSchema.getElementType();
      auto srcList = src.getList();
      Orphan<DynamicList> result = orphanage.newOrphan(listSchema, srcList.size());
      auto dstList = result.get();
      for (uint i = 0; i < srcList.size(); i++) {
        KJ_IF_MAYBE(value, compileValue(srcList[i], elementType)) {
          dstList.adopt(i, kj::mv(*value));
        }
      }
      return kj::mv(result);
    }

    case Expression::TUPLE: {
      if (!type.isStruct()) {
        errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
        return nullptr;
      }
      auto structSchema = type.asStruct();
      Orphan<DynamicStruct> result = orphanage.newOrphan(structSchema);
      fillStructValue(result.get(), src.getTuple());
      return kj::mv(result);
    }

    case Expression::UNKNOWN:
      // Ignore earlier error.
      return nullptr;
  }

  KJ_UNREACHABLE;
}